

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpandBetween(FixNewlines *this,ArgParams *params)

{
  bool bVar1;
  int iVar2;
  FixNewlines *in_RDI;
  ArgParam *param;
  iterator __end2;
  iterator __begin2;
  ArgParams *__range2;
  bool first;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_30 [2];
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar3;
  
  bVar3 = 1;
  local_30[0]._M_current =
       (ArgParam *)
       std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::begin
                 ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_RDI);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::end
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_RDI);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
         ::operator*(local_30);
    if ((bVar3 & 1) == 0) {
      argParamOpenFodder(in_RDI,(ArgParam *)0x2c6cad);
      iVar2 = countNewlines((Fodder *)CONCAT17(bVar3,in_stack_ffffffffffffffe0));
      if (0 < iVar2) {
        return true;
      }
    }
    bVar3 = 0;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

bool shouldExpandBetween(ArgParams &params)
    {
        bool first = true;
        for (auto &param : params) {
            if (!first && countNewlines(argParamOpenFodder(param)) > 0) {
                return true;
            }
            first = false;
        }
        return false;
    }